

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worn.c
# Opt level: O3

void mon_break_armor(level *lev,monst *mon,boolean polyspot)

{
  byte bVar1;
  char cVar2;
  short sVar3;
  permonst *ptr;
  char *pcVar4;
  boolean bVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  permonst *ppVar9;
  char *pcVar10;
  char *pcVar11;
  long lVar12;
  long lVar13;
  obj *poVar14;
  obj *poVar15;
  obj *poVar16;
  bool bVar17;
  char buf [256];
  char local_138 [264];
  
  ptr = mon->data;
  if ((ptr->mflags1 & 0x2000) == 0) {
    bVar17 = ptr->msize != '\0';
  }
  else {
    bVar17 = false;
  }
  bVar1 = viz_array[mon->my][mon->mx];
  iVar6 = pronoun_gender(lev,mon);
  pcVar10 = genders[iVar6].him;
  iVar6 = pronoun_gender(lev,mon);
  pcVar4 = genders[iVar6].his;
  bVar5 = breakarm(ptr);
  if (bVar5 == '\0') {
    bVar5 = sliparm(ptr);
    if (bVar5 != '\0') {
      poVar14 = (obj *)&mon->minvent;
      poVar15 = poVar14;
      do {
        poVar15 = poVar15->nobj;
        poVar16 = poVar14;
        if (poVar15 == (obj *)0x0) goto LAB_0028daa2;
      } while ((poVar15->owornmask & 1) == 0);
      if ((bVar1 & 2) == 0) {
        You_hear("a thud.");
      }
      else {
        pcVar11 = Monnam(mon);
        pcVar11 = s_suffix(pcVar11);
        pline("%s armor falls around %s!",pcVar11,pcVar10);
      }
      if (polyspot != '\0') {
        poVar15->field_0x4d = poVar15->field_0x4d | 4;
        flags.bypasses = '\x01';
      }
      m_lose_armor(mon,poVar15);
LAB_0028daa2:
      do {
        poVar16 = poVar16->nobj;
        if (poVar16 == (obj *)0x0) goto LAB_0028dbff;
      } while ((poVar16->owornmask & 2) == 0);
      if ((bVar1 & 2) != 0) {
        ppVar9 = mon->data;
        cVar2 = ppVar9->mlet;
        pcVar10 = Monnam(mon);
        if (ppVar9 == mons + 0x9f || cVar2 == '\x16') {
          pcVar10 = s_suffix(pcVar10);
          pcVar11 = cloak_simple_name(poVar16);
          pline("%s %s falls, unsupported!",pcVar10,pcVar11);
        }
        else {
          pcVar11 = cloak_simple_name(poVar16);
          pline("%s shrinks out of %s %s!",pcVar10,pcVar4,pcVar11);
        }
      }
      if (polyspot != '\0') {
        poVar16->field_0x4d = poVar16->field_0x4d | 4;
        flags.bypasses = '\x01';
      }
      m_lose_armor(mon,poVar16);
LAB_0028dbff:
      do {
        poVar14 = poVar14->nobj;
        if (poVar14 == (obj *)0x0) goto LAB_0028dc6f;
      } while ((poVar14->owornmask & 0x40) == 0);
      if ((bVar1 & 2) != 0) {
        bVar5 = sliparm(mon->data);
        pcVar10 = Monnam(mon);
        pcVar11 = "%s seeps right through %s shirt!";
        if (bVar5 == '\0') {
          pcVar11 = "%s becomes much too small for %s shirt!";
        }
        pline(pcVar11,pcVar10,pcVar4);
      }
      if (polyspot != '\0') {
        poVar14->field_0x4d = poVar14->field_0x4d | 4;
        flags.bypasses = '\x01';
      }
      m_lose_armor(mon,poVar14);
    }
  }
  else {
    poVar14 = (obj *)&mon->minvent;
    poVar15 = poVar14;
    do {
      poVar15 = poVar15->nobj;
      poVar16 = poVar14;
      if (poVar15 == (obj *)0x0) goto LAB_0028d9c2;
    } while ((poVar15->owornmask & 1) == 0);
    sVar3 = poVar15->otyp;
    if ((ushort)(sVar3 - 0x5fU) < 0xb) {
      ppVar9 = mons + (long)sVar3 + 0x34;
LAB_0028d97a:
      if (ptr != ppVar9) goto LAB_0028d97f;
    }
    else {
      if ((ushort)(sVar3 - 0x54U) < 0xb) {
        ppVar9 = mons + (long)sVar3 + 0x3f;
        goto LAB_0028d97a;
      }
LAB_0028d97f:
      if ((bVar1 & 2) == 0) {
        You_hear("a cracking sound.");
      }
      else {
        pcVar10 = Monnam(mon);
        pline("%s breaks out of %s armor!",pcVar10,pcVar4);
      }
    }
    m_useup(mon,poVar15);
LAB_0028d9c2:
    do {
      poVar16 = poVar16->nobj;
      if (poVar16 == (obj *)0x0) goto LAB_0028db5c;
    } while ((poVar16->owornmask & 2) == 0);
    if (poVar16->oartifact == '\0') {
      if ((bVar1 & 2) == 0) {
        You_hear("a ripping sound.");
      }
      else {
        pcVar10 = Monnam(mon);
        pcVar10 = s_suffix(pcVar10);
        pcVar11 = cloak_simple_name(poVar16);
        pline("%s %s tears apart!",pcVar10,pcVar11);
      }
      m_useup(mon,poVar16);
    }
    else {
      if ((bVar1 & 2) != 0) {
        pcVar10 = Monnam(mon);
        pcVar10 = s_suffix(pcVar10);
        pcVar11 = cloak_simple_name(poVar16);
        pline("%s %s falls off!",pcVar10,pcVar11);
      }
      if (polyspot != '\0') {
        poVar16->field_0x4d = poVar16->field_0x4d | 4;
        flags.bypasses = '\x01';
      }
      m_lose_armor(mon,poVar16);
    }
LAB_0028db5c:
    do {
      poVar14 = poVar14->nobj;
      if (poVar14 == (obj *)0x0) goto LAB_0028dc6f;
    } while ((poVar14->owornmask & 0x40) == 0);
    if ((bVar1 & 2) == 0) {
      You_hear("a ripping sound.");
    }
    else {
      pcVar10 = Monnam(mon);
      pcVar10 = s_suffix(pcVar10);
      pline("%s shirt rips to shreds!",pcVar10);
    }
    m_useup(mon,poVar14);
  }
LAB_0028dc6f:
  if (bVar17) {
    iVar6 = num_horns(ptr);
    if (0 < iVar6) goto LAB_0028dd66;
LAB_0028de21:
    if (((ptr->mflags1 & 0x80000) != 0) || (ptr->mlet == '\x1d')) goto LAB_0028de33;
  }
  else {
    poVar14 = (obj *)&mon->minvent;
    poVar15 = poVar14;
    do {
      poVar15 = poVar15->nobj;
      if (poVar15 == (obj *)0x0) goto LAB_0028dcfd;
    } while ((poVar15->owornmask & 0x10) == 0);
    if ((bVar1 & 2) != 0) {
      pcVar10 = Monnam(mon);
      pcVar11 = " and weapon";
      if (mon->mw == (obj *)0x0) {
        pcVar11 = "";
      }
      pline("%s drops %s gloves%s!",pcVar10,pcVar4,pcVar11);
    }
    if (polyspot != '\0') {
      poVar15->field_0x4d = poVar15->field_0x4d | 4;
      flags.bypasses = '\x01';
    }
    m_lose_armor(mon,poVar15);
LAB_0028dcfd:
    do {
      poVar14 = poVar14->nobj;
      if (poVar14 == (obj *)0x0) goto LAB_0028dd66;
    } while ((poVar14->owornmask & 8) == 0);
    if ((bVar1 & 2) == 0) {
      You_hear("a clank.");
    }
    else {
      pcVar10 = Monnam(mon);
      pline("%s can no longer hold %s shield!",pcVar10,pcVar4);
    }
    if (polyspot != '\0') {
      poVar14->field_0x4d = poVar14->field_0x4d | 4;
      flags.bypasses = '\x01';
    }
    m_lose_armor(mon,poVar14);
LAB_0028dd66:
    poVar14 = (obj *)&mon->minvent;
    do {
      poVar14 = poVar14->nobj;
      if (poVar14 == (obj *)0x0) goto LAB_0028de1c;
    } while ((poVar14->owornmask & 4) == 0);
    if ((bVar17) &&
       (((long)poVar14->otyp == 0x3d ||
        ((*(ushort *)&objects[poVar14->otyp].field_0x11 & 0x180) == 0)))) goto LAB_0028de21;
    if ((bVar1 & 2) == 0) {
      You_hear("a clank.");
    }
    else {
      pcVar10 = Monnam(mon);
      pcVar10 = s_suffix(pcVar10);
      pcVar11 = surface((int)mon->mx,(int)mon->my);
      pline("%s helmet falls to the %s!",pcVar10,pcVar11);
    }
    if (polyspot != '\0') {
      poVar14->field_0x4d = poVar14->field_0x4d | 4;
      flags.bypasses = '\x01';
    }
    m_lose_armor(mon,poVar14);
LAB_0028de1c:
    if (bVar17) goto LAB_0028de21;
LAB_0028de33:
    poVar14 = (obj *)&mon->minvent;
    do {
      poVar14 = poVar14->nobj;
      if (poVar14 == (obj *)0x0) goto LAB_0028deef;
    } while ((poVar14->owornmask & 0x20) == 0);
    if ((bVar1 & 2) != 0) {
      ppVar9 = mon->data;
      cVar2 = ppVar9->mlet;
      pcVar10 = Monnam(mon);
      pcVar10 = s_suffix(pcVar10);
      if (ppVar9 == mons + 0x9f || cVar2 == '\x16') {
        pline("%s boots fall away!",pcVar10);
      }
      else {
        pcVar11 = "are pushed";
        if (ptr->msize == '\0') {
          pcVar11 = "slide";
        }
        pline("%s boots %s off %s feet!",pcVar10,pcVar11,pcVar4);
      }
    }
    if (polyspot != '\0') {
      poVar14->field_0x4d = poVar14->field_0x4d | 4;
      flags.bypasses = '\x01';
    }
    m_lose_armor(mon,poVar14);
  }
LAB_0028deef:
  bVar5 = can_saddle(mon);
  if (bVar5 == '\0') {
    poVar14 = (obj *)&mon->minvent;
    do {
      poVar14 = poVar14->nobj;
      if (poVar14 == (obj *)0x0) goto LAB_0028df79;
    } while ((poVar14->owornmask & 0x100000) == 0);
    if (polyspot != '\0') {
      poVar14->field_0x4d = poVar14->field_0x4d | 4;
      flags.bypasses = '\x01';
    }
    m_lose_armor(mon,poVar14);
    if ((bVar1 & 2) != 0) {
      pcVar10 = Monnam(mon);
      pcVar10 = s_suffix(pcVar10);
      pline("%s saddle falls off.",pcVar10);
    }
LAB_0028df79:
    if (u.usteed != mon) {
      return;
    }
  }
  else {
    if (u.usteed != mon) {
      return;
    }
    bVar5 = can_ride(mon);
    if (bVar5 != '\0') {
      return;
    }
  }
  pcVar10 = mon_nam(mon);
  pline("You can no longer ride %s.",pcVar10);
  if (((((u.usteed)->data == mons + 0xc) || ((u.usteed)->data == mons + 0xb)) &&
      (u.uprops[8].extrinsic == 0)) && (((byte)youmonst.mintrinsics & 0x80) == 0)) {
    uVar7 = mt_random();
    uVar7 = uVar7 % 3;
    lVar13 = (long)u.uluck;
    lVar12 = (long)u.moreluck;
    if (((int)(lVar12 + lVar13) != 0) &&
       (uVar8 = mt_random(), SUB168(ZEXT416(uVar8) % SEXT816(0x32 - (lVar12 + lVar13)),0) != 0)) {
      iVar6 = (int)u.moreluck + (int)u.uluck;
      if (-6 < iVar6) {
        sVar3 = (short)((uint)(iVar6 * 0x5556) >> 0x10);
        iVar6 = (int)(short)(sVar3 - (sVar3 >> 0xf));
      }
      uVar7 = uVar7 - iVar6;
      if ((int)uVar7 < 0) goto LAB_0028e0dc;
      if (1 < uVar7) {
        uVar7 = 2;
      }
    }
    if (uVar7 != 0) {
      pcVar10 = mon_nam(u.usteed);
      pline("You touch %s.",pcVar10);
      pcVar10 = mons_mname((u.usteed)->data);
      pcVar10 = an(pcVar10);
      sprintf(local_138,"falling off %s",pcVar10);
      delayed_petrify((char *)0x0,local_138);
    }
  }
LAB_0028e0dc:
  dismount_steed(1);
  return;
}

Assistant:

void mon_break_armor(struct level *lev, struct monst *mon, boolean polyspot)
{
	struct obj *otmp;
	const struct permonst *mdat = mon->data;
	boolean vis = cansee(mon->mx, mon->my);
	boolean handless_or_tiny = (nohands(mdat) || verysmall(mdat));
	const char *pronoun = mhim(lev, mon),
		   *ppronoun = mhis(lev, mon);

	if (breakarm(mdat)) {
	    if ((otmp = which_armor(mon, W_ARM)) != 0) {
		if ((Is_dragon_scales(otmp->otyp) &&
			mdat == Dragon_scales_to_pm(otmp)) ||
		    (Is_dragon_mail(otmp->otyp) && mdat == Dragon_mail_to_pm(otmp)))
		    ;	/* no message here;
			   "the dragon merges with his scaly armor" is odd
			   and the monster's previous form is already gone */
		else if (vis)
		    pline("%s breaks out of %s armor!", Monnam(mon), ppronoun);
		else
		    You_hear("a cracking sound.");
		m_useup(mon, otmp);
	    }
	    if ((otmp = which_armor(mon, W_ARMC)) != 0) {
		if (otmp->oartifact) {
		    if (vis)
			pline("%s %s falls off!", s_suffix(Monnam(mon)),
				cloak_simple_name(otmp));
		    if (polyspot) bypass_obj(otmp);
		    m_lose_armor(mon, otmp);
		} else {
		    if (vis)
			pline("%s %s tears apart!", s_suffix(Monnam(mon)),
				cloak_simple_name(otmp));
		    else
			You_hear("a ripping sound.");
		    m_useup(mon, otmp);
		}
	    }
	    if ((otmp = which_armor(mon, W_ARMU)) != 0) {
		if (vis)
		    pline("%s shirt rips to shreds!", s_suffix(Monnam(mon)));
		else
		    You_hear("a ripping sound.");
		m_useup(mon, otmp);
	    }
	} else if (sliparm(mdat)) {
	    if ((otmp = which_armor(mon, W_ARM)) != 0) {
		if (vis)
		    pline("%s armor falls around %s!",
				 s_suffix(Monnam(mon)), pronoun);
		else
		    You_hear("a thud.");
		if (polyspot) bypass_obj(otmp);
		m_lose_armor(mon, otmp);
	    }
	    if ((otmp = which_armor(mon, W_ARMC)) != 0) {
		if (vis) {
		    if (is_whirly(mon->data))
			pline("%s %s falls, unsupported!",
				     s_suffix(Monnam(mon)), cloak_simple_name(otmp));
		    else
			pline("%s shrinks out of %s %s!", Monnam(mon),
						ppronoun, cloak_simple_name(otmp));
		}
		if (polyspot) bypass_obj(otmp);
		m_lose_armor(mon, otmp);
	    }
	    if ((otmp = which_armor(mon, W_ARMU)) != 0) {
		if (vis) {
		    if (sliparm(mon->data))
			pline("%s seeps right through %s shirt!",
					Monnam(mon), ppronoun);
		    else
			pline("%s becomes much too small for %s shirt!",
					Monnam(mon), ppronoun);
		}
		if (polyspot) bypass_obj(otmp);
		m_lose_armor(mon, otmp);
	    }
	}
	if (handless_or_tiny) {
	    /* [caller needs to handle weapon checks] */
	    if ((otmp = which_armor(mon, W_ARMG)) != 0) {
		if (vis)
		    pline("%s drops %s gloves%s!", Monnam(mon), ppronoun,
					MON_WEP(mon) ? " and weapon" : "");
		if (polyspot) bypass_obj(otmp);
		m_lose_armor(mon, otmp);
	    }
	    if ((otmp = which_armor(mon, W_ARMS)) != 0) {
		if (vis)
		    pline("%s can no longer hold %s shield!", Monnam(mon),
								ppronoun);
		else
		    You_hear("a clank.");
		if (polyspot) bypass_obj(otmp);
		m_lose_armor(mon, otmp);
	    }
	}
	if (handless_or_tiny || has_horns(mdat)) {
	    if ((otmp = which_armor(mon, W_ARMH)) != 0 &&
		    /* flimsy test for horns matches polyself handling */
		    (handless_or_tiny || !is_flimsy(otmp))) {
		if (vis)
		    pline("%s helmet falls to the %s!",
			  s_suffix(Monnam(mon)), surface(mon->mx, mon->my));
		else
		    You_hear("a clank.");
		if (polyspot) bypass_obj(otmp);
		m_lose_armor(mon, otmp);
	    }
	}
	if (handless_or_tiny || slithy(mdat) || mdat->mlet == S_CENTAUR) {
	    if ((otmp = which_armor(mon, W_ARMF)) != 0) {
		if (vis) {
		    if (is_whirly(mon->data))
			pline("%s boots fall away!",
				       s_suffix(Monnam(mon)));
		    else pline("%s boots %s off %s feet!",
			s_suffix(Monnam(mon)),
			verysmall(mdat) ? "slide" : "are pushed", ppronoun);
		}
		if (polyspot) bypass_obj(otmp);
		m_lose_armor(mon, otmp);
	    }
	}
	if (!can_saddle(mon)) {
	    if ((otmp = which_armor(mon, W_SADDLE)) != 0) {
		if (polyspot) bypass_obj(otmp);
		m_lose_armor(mon, otmp);
		if (vis)
		    pline("%s saddle falls off.", s_suffix(Monnam(mon)));
	    }
	    if (mon == u.usteed)
		goto noride;
	} else if (mon == u.usteed && !can_ride(mon)) {
	noride:
	    pline("You can no longer ride %s.", mon_nam(mon));
	    if (touch_petrifies(u.usteed->data) &&
			!Stone_resistance && rnl(3)) {
		char buf[BUFSZ];

		pline("You touch %s.", mon_nam(u.usteed));
		sprintf(buf, "falling off %s",
				an(mons_mname(u.usteed->data)));
		delayed_petrify(NULL, buf);
	    }
	    dismount_steed(DISMOUNT_FELL);
	}
	return;
}